

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O3

VisitStatus
Fixpp::impl::
visitDictionary<should_skip_unknown_tags::Spec::Dictionary,Fixpp::TypedParsingContext<void>,Fixpp::impl::MessageVisitor<should_skip_unknown_tags::Visitor,should_skip_unknown_tags::VisitRules>,should_skip_unknown_tags::VisitRules>
          (long context,undefined8 visitor)

{
  char cVar1;
  VisitStatus VVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  
  VVar2 = VersionMismatch;
  if (*(long *)(context + 0x48) == 7) {
    pcVar4 = *(char **)(context + 0x40);
    lVar3 = 0;
    uVar5 = 0;
    do {
      cVar1 = *pcVar4;
      pcVar4 = pcVar4 + 1;
      uVar5 = uVar5 | (long)cVar1 << ((byte)lVar3 & 0x3f);
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x38);
    VVar2 = VersionMismatch;
    if (((uVar5 == 0x342e342e584946) && (VVar2 = NotFound, *(long *)(context + 0x60) == 1)) &&
       (**(char **)(context + 0x58) == 'W')) {
      MessageVisitor<should_skip_unknown_tags::Visitor,should_skip_unknown_tags::VisitRules>::
      operator()(visitor);
      VVar2 = Ok;
    }
  }
  return VVar2;
}

Assistant:

VisitStatus visitDictionary(Context& context, Visitor& visitor, Rules)
        {
            using Version = typename Dictionary::Version;
            using Header = typename Dictionary::Header::Ref;
            using Messages = typename Dictionary::Messages;

            using Overrides = typename Rules::Overrides;

            auto version = context.version.first;
            auto versionSize = context.version.second;

            using MessageVisitor = DictionaryVisitor<Header, Overrides>;

            if (Version::equals(version, versionSize))
            {
                using AllMessagesVisitor = meta::typelist::ops::Visitor<Messages, MessageVisitor>;
                if (AllMessagesVisitor::visit(context, visitor))
                    return VisitStatus::Ok;

                return VisitStatus::NotFound;
            }

            return VisitStatus::VersionMismatch;
        }